

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# output.c
# Opt level: O1

void output_semantic_actions(void)

{
  FILE *__stream;
  int iVar1;
  int __c;
  uint uVar2;
  char cVar3;
  char cVar4;
  
  fclose((FILE *)action_file);
  action_file = (FILE *)fopen(action_file_name,"r");
  if ((FILE *)action_file == (FILE *)0x0) {
    open_error(action_file_name);
  }
  iVar1 = getc((FILE *)action_file);
  __stream = code_file;
  if (iVar1 != -1) {
    cVar4 = '\x01';
    do {
      __c = iVar1;
      if (__c == 10) {
        cVar3 = '\x01';
        iVar1 = outline + 1;
        if (cVar4 != '\x02') goto LAB_00110c4c;
        uVar2 = outline + 2;
        outline = outline + 1;
        fprintf((FILE *)__stream,line_format + 1,(ulong)uVar2,code_file_name);
        cVar3 = '\x01';
      }
      else {
        cVar3 = (__c == 0x23 && cVar4 == '\x01') * '\x02';
        iVar1 = outline;
LAB_00110c4c:
        outline = iVar1;
        putc(__c,(FILE *)__stream);
      }
      iVar1 = getc((FILE *)action_file);
      cVar4 = cVar3;
    } while (iVar1 != -1);
    if (__c != 10) {
      outline = outline + 1;
      putc(10,(FILE *)__stream);
    }
    if (lflag == '\0') {
      uVar2 = outline + 2;
      outline = outline + 1;
      fprintf((FILE *)__stream,line_format,(ulong)uVar2,code_file_name);
      return;
    }
  }
  return;
}

Assistant:

void output_semantic_actions()
{
    register int c, last;
    register FILE *out;
    register int state;	/* 0=middle of line, 1=start of line, 2=seen '#' */

    state = 1;
    fclose(action_file);
    action_file = fopen(action_file_name, "r");
    if (action_file == NULL)
	open_error(action_file_name);

    if ((c = getc(action_file)) == EOF)
	return;

    out = code_file;
    do {
	last = c;
	if (c == '\n') {
	    ++outline;
	    if (state == 2) {
		fprintf(out, line_format+1, outline + 1, code_file_name);
		state = 1;
		continue; }
	    state = 1; }
	else if (state == 1 && c == '#')
	    state = 2;
	else
	    state = 0;
	putc(c, out);
    } while ((c = getc(action_file)) != EOF);

    if (last != '\n')
    {
	++outline;
	putc('\n', out);
    }

    if (!lflag)
	fprintf(out, line_format, ++outline + 1, code_file_name);
}